

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O3

void FileWatcherDestroy(HFileWatcher handle)

{
  LOCK();
  *(undefined1 *)((long)handle + 0x28) = 1;
  UNLOCK();
  std::thread::join();
  if (*(long *)((long)handle + 0x30) == 0) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)handle + 0x10));
    operator_delete(handle,0x68);
    return;
  }
  std::terminate();
}

Assistant:

void FileWatcherDestroy(HFileWatcher handle) {
    FileWatcher* watcher = (FileWatcher*)handle;
    watcher->ShouldQuit.store(true);
    watcher->WatcherThread.join();
    delete watcher;
}